

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool,false,false>
               (char *ldata,char *rdata,bool *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t i;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      result_data[iVar3] = ldata[iVar3] == rdata[iVar3];
    }
  }
  else {
    uVar5 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      uVar2 = puVar1[uVar4];
      uVar7 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar7 = count;
      }
      uVar6 = uVar7;
      if (uVar2 != 0) {
        uVar6 = uVar5;
        if (uVar2 == 0xffffffffffffffff) {
          for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
            result_data[uVar6] = ldata[uVar6] == rdata[uVar6];
          }
        }
        else {
          for (uVar8 = 0; uVar6 = uVar5 + uVar8, uVar5 + uVar8 < uVar7; uVar8 = uVar8 + 1) {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              result_data[uVar8 + uVar5] = ldata[uVar8 + uVar5] == rdata[uVar8 + uVar5];
            }
          }
        }
      }
      uVar5 = uVar6;
    }
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}